

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O2

bool __thiscall ODDLParser::OpenDDLParser::parse(OpenDDLParser *this)

{
  char *end;
  Context *this_00;
  DDLNode *pDVar1;
  char *in;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  bool bVar5;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  if ((this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar5 = false;
  }
  else {
    normalizeBuffer(&this->m_buffer);
    this_00 = (Context *)operator_new(8);
    Context::Context(this_00);
    this->m_context = this_00;
    std::__cxx11::string::string((string *)&local_38,"root",&local_59);
    std::__cxx11::string::string((string *)&local_58,"",&local_5a);
    pDVar1 = DDLNode::create(&local_38,&local_58,(DDLNode *)0x0);
    this->m_context->m_root = pDVar1;
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    pushNode(this,this->m_context->m_root);
    in = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
    uVar3 = 0;
    end = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish;
    pcVar2 = in;
    pcVar4 = end;
    while (bVar5 = (ulong)((long)pcVar4 - (long)pcVar2) <= uVar3, !bVar5) {
      in = parseNextNode(this,in,end);
      if (in == (char *)0x0) {
        return bVar5;
      }
      pcVar2 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = (long)in - (long)pcVar2;
      pcVar4 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
  }
  return bVar5;
}

Assistant:

const char *OpenDDLParser::getVersion() {
    return Version;
}